

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesLongMessageForm.cxx
# Opt level: O3

void __thiscall cmCursesLongMessageForm::DrawMessage(cmCursesLongMessageForm *this,char *msg)

{
  char cVar1;
  int c;
  FORM *form;
  ulong uVar2;
  
  cVar1 = *msg;
  if (cVar1 != '\0') {
    uVar2 = 0;
    do {
      if ((cVar1 == '\n') && (msg[uVar2 + 1] != '\0')) {
        form_driver((this->super_cmCursesForm).Form,0x212);
        form = (this->super_cmCursesForm).Form;
        c = 0x218;
      }
      else {
        form = (this->super_cmCursesForm).Form;
        c = (int)cVar1;
      }
      form_driver(form,c);
      if (0xea5e < uVar2) break;
      cVar1 = msg[uVar2 + 1];
      uVar2 = uVar2 + 1;
    } while (cVar1 != '\0');
  }
  form_driver((this->super_cmCursesForm).Form,this->Scrolling == ScrollDown | 0x216);
  return;
}

Assistant:

void cmCursesLongMessageForm::DrawMessage(const char* msg) const
{
  int i = 0;
  while (msg[i] != '\0' && i < MAX_CONTENT_SIZE) {
    if (msg[i] == '\n' && msg[i + 1] != '\0') {
      form_driver(this->Form, REQ_NEXT_LINE);
      form_driver(this->Form, REQ_BEG_LINE);
    } else {
      form_driver(this->Form, msg[i]);
    }
    i++;
  }
  if (this->Scrolling == ScrollBehavior::ScrollDown) {
    form_driver(this->Form, REQ_END_FIELD);
  } else {
    form_driver(this->Form, REQ_BEG_FIELD);
  }
}